

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

int Vector4Equals(Vector4 p,Vector4 q)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = ABS(p.x);
  fVar4 = ABS(q.x);
  fVar2 = fVar4;
  if (fVar4 <= fVar3) {
    fVar2 = fVar3;
  }
  fVar2 = (float)(~-(uint)NAN(fVar3) & (uint)fVar2 | -(uint)NAN(fVar3) & (uint)fVar4);
  if (fVar2 <= 1.0) {
    fVar2 = 1.0;
  }
  uVar1 = 0;
  if (ABS(p.x - q.x) <= fVar2 * 1e-06) {
    fVar3 = ABS(p.y);
    fVar4 = ABS(q.y);
    fVar2 = fVar4;
    if (fVar4 <= fVar3) {
      fVar2 = fVar3;
    }
    fVar2 = (float)(~-(uint)NAN(fVar3) & (uint)fVar2 | -(uint)NAN(fVar3) & (uint)fVar4);
    if (fVar2 <= 1.0) {
      fVar2 = 1.0;
    }
    if (ABS(p.y - q.y) <= fVar2 * 1e-06) {
      fVar3 = ABS(p.z);
      fVar4 = ABS(q.z);
      fVar2 = fVar4;
      if (fVar4 <= fVar3) {
        fVar2 = fVar3;
      }
      fVar2 = (float)(~-(uint)NAN(fVar3) & (uint)fVar2 | -(uint)NAN(fVar3) & (uint)fVar4);
      if (fVar2 <= 1.0) {
        fVar2 = 1.0;
      }
      if (ABS(p.z - q.z) <= fVar2 * 1e-06) {
        fVar3 = ABS(p.w);
        fVar4 = ABS(q.w);
        fVar2 = fVar4;
        if (fVar4 <= fVar3) {
          fVar2 = fVar3;
        }
        fVar2 = (float)(~-(uint)NAN(fVar3) & (uint)fVar2 | -(uint)NAN(fVar3) & (uint)fVar4);
        if (fVar2 <= 1.0) {
          fVar2 = 1.0;
        }
        uVar1 = (uint)(ABS(p.w - q.w) <= fVar2 * 1e-06);
      }
    }
  }
  return uVar1;
}

Assistant:

RMAPI int Vector4Equals(Vector4 p, Vector4 q)
{
#if !defined(EPSILON)
    #define EPSILON 0.000001f
#endif

    int result = ((fabsf(p.x - q.x)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.x), fabsf(q.x))))) &&
                  ((fabsf(p.y - q.y)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.y), fabsf(q.y))))) &&
                  ((fabsf(p.z - q.z)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.z), fabsf(q.z))))) &&
                  ((fabsf(p.w - q.w)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.w), fabsf(q.w)))));
    return result;
}